

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iomapper.cpp
# Opt level: O1

bool __thiscall
glslang::TIoMapper::addStage
          (TIoMapper *this,EShLanguage stage,TIntermediate *intermediate,TInfoSink *infoSink,
          TIoMapResolver *resolver)

{
  TDestinationStack *pTVar1;
  _Rb_tree_header *p_Var2;
  EShLanguage EVar3;
  char *__s;
  _List_node_base *p_Var4;
  pointer pcVar5;
  _Base_ptr p_Var6;
  _List_node_base *p_Var7;
  undefined8 *******pppppppuVar8;
  undefined8 *******pppppppuVar9;
  undefined4 uVar10;
  undefined8 uVar11;
  pointer pTVar12;
  pointer pTVar13;
  TIoMapResolver *pTVar14;
  int iVar15;
  _Base_ptr p_Var16;
  undefined4 extraout_var;
  iterator iVar17;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ulong uVar18;
  undefined4 in_register_00000034;
  pool_allocator<char> *ppVar19;
  undefined8 *puVar20;
  long lVar21;
  byte bVar22;
  __normal_iterator<glslang::TVarLivePair_*,_std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>_>
  __i;
  long lVar23;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
  *ppVar24;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
  *ppVar25;
  TVarLivePair *var;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
  *ppVar26;
  bool bVar27;
  char cVar28;
  byte bVar29;
  bool hadError;
  TVarLiveVector uniformVector;
  TVarLiveVector outVector;
  TVarLiveVector inVector;
  TResolverInOutAdaptor inOutResolve;
  TVarLiveMap uniformVarMap;
  TVarLiveMap outVarMap;
  TVarLiveMap inVarMap;
  TVarLiveMap *dummyUniformVarMap [14];
  TDefaultHlslIoResolver defaultHlslResolver;
  TDefaultIoResolver defaultResolver;
  undefined1 local_64d [13];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
  *ppStack_640;
  long local_638;
  vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_> local_628;
  vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_> local_608;
  TIntermNode *local_5f0;
  TLiveTraverser *local_5e8;
  TInfoSink *local_5e0;
  TIoMapResolver *local_5d8;
  TResolverInOutAdaptor local_5d0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
  local_5b0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
  local_580;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
  local_550;
  undefined1 local_520 [32];
  undefined8 uStack_500;
  _Base_ptr p_Stack_4f8;
  TIntermSymbol *pTStack_4f0;
  _Base_ptr local_4e8;
  _Base_ptr p_Stack_4e0;
  _Base_ptr local_4d8;
  TIntermediate *pTStack_4d0;
  undefined1 local_4c8 [56];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_490;
  undefined1 local_458;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
  *local_450;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
  *local_448;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
  *local_440;
  pool_allocator<char> local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  TLiveTraverser local_3c0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
  *local_2f0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
  *local_2e8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
  *local_2e0;
  undefined **local_2d8;
  undefined2 local_2d0;
  undefined8 local_2ce;
  undefined2 local_2c6;
  TPoolAllocator *local_2c0;
  undefined8 uStack_2b8;
  undefined8 local_2b0;
  undefined8 uStack_2a8;
  undefined8 ******local_2a0;
  undefined8 ******local_298;
  undefined8 local_290;
  TIntermediate *local_288;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_280;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_248;
  undefined1 local_210;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
  *local_208;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
  *local_200;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
  *local_1f8;
  TIoMapResolver local_1f0;
  _Hashtable<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_1e8;
  undefined1 local_1b0;
  TIntermediate *local_1a8;
  int local_1a0;
  undefined8 local_19c;
  undefined7 uStack_194;
  undefined1 uStack_18d;
  undefined7 uStack_18c;
  TIoMapResolver local_180 [15];
  _Hashtable<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_108;
  undefined1 local_d0;
  TIntermediate *local_c8;
  int local_c0;
  undefined8 local_bc;
  undefined7 uStack_b4;
  undefined1 uStack_ad;
  undefined7 uStack_ac;
  undefined8 local_a0 [14];
  
  bVar29 = 0;
  cVar28 = '\x01';
  if (((intermediate->resourceSetBinding).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start ==
       (intermediate->resourceSetBinding).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) && (intermediate->autoMapBindings == false)) {
    cVar28 = intermediate->autoMapLocations;
  }
  if (cVar28 == '\0') {
    lVar21 = 0;
    uVar18 = 0;
    cVar28 = false;
    do {
      bVar27 = (bool)cVar28 == false;
      cVar28 = true;
      if ((bVar27) && ((intermediate->shiftBinding)._M_elems[uVar18] == 0)) {
        cVar28 = *(long *)((long)&(intermediate->shiftBindingForSet)._M_elems[0]._M_t._M_impl.
                                  super__Rb_tree_header._M_node_count + lVar21) != 0;
      }
      if (4 < uVar18) break;
      uVar18 = uVar18 + 1;
      lVar21 = lVar21 + 0x30;
    } while ((bool)cVar28 == false);
  }
  if ((resolver != (TIoMapResolver *)0x0) || (bVar22 = 1, cVar28 != '\0')) {
    if ((intermediate->numEntryPoints == 1) && (intermediate->recursive == false)) {
      local_5f0 = intermediate->treeRoot;
      bVar22 = 0;
      if (local_5f0 != (TIntermNode *)0x0) {
        local_108._M_buckets = &local_108._M_single_bucket;
        local_108._M_bucket_count = 1;
        local_108._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        local_108._M_element_count = 0;
        local_108._M_rehash_policy._M_max_load_factor = 1.0;
        local_108._M_rehash_policy._M_next_resize = 0;
        local_108._M_single_bucket = (__node_base_ptr)0x0;
        local_d0 = 0;
        local_c8 = intermediate;
        local_c0 = intermediate->uniformLocationBase;
        local_a0[0] = 0;
        local_a0[1] = 0;
        local_a0[2] = 0;
        local_a0[3] = 0;
        local_a0[4] = 0;
        local_a0[5] = 0;
        local_a0[6] = 0;
        local_a0[7] = 0;
        local_a0[8] = 0;
        local_a0[9] = 0;
        local_a0[10] = 0;
        local_a0[0xb] = 0;
        local_a0[0xc] = 0;
        local_a0[0xd] = 0;
        local_bc = 0;
        uStack_b4 = 0;
        uStack_ad = 0;
        uStack_ac = 0;
        EVar3 = intermediate->language;
        local_a0[EVar3] = intermediate;
        local_180[0xe]._vptr_TIoMapResolver = (_func_int **)&PTR__TDefaultIoResolverBase_00b0dea0;
        local_1e8._M_buckets = &local_1e8._M_single_bucket;
        local_1e8._M_bucket_count = 1;
        local_1e8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        local_1e8._M_element_count = 0;
        local_1e8._M_rehash_policy._M_max_load_factor = 1.0;
        local_1e8._M_rehash_policy._M_next_resize = 0;
        local_1e8._M_single_bucket = (__node_base_ptr)0x0;
        local_1b0 = 0;
        local_1a8 = intermediate;
        local_1a0 = local_c0;
        local_180[0]._vptr_TIoMapResolver = (_func_int **)0x0;
        local_180[1]._vptr_TIoMapResolver = (_func_int **)0x0;
        local_180[2]._vptr_TIoMapResolver = (_func_int **)0x0;
        local_180[3]._vptr_TIoMapResolver = (_func_int **)0x0;
        local_180[4]._vptr_TIoMapResolver = (_func_int **)0x0;
        local_180[5]._vptr_TIoMapResolver = (_func_int **)0x0;
        local_180[6]._vptr_TIoMapResolver = (_func_int **)0x0;
        local_180[7]._vptr_TIoMapResolver = (_func_int **)0x0;
        local_180[8]._vptr_TIoMapResolver = (_func_int **)0x0;
        local_180[9]._vptr_TIoMapResolver = (_func_int **)0x0;
        local_180[10]._vptr_TIoMapResolver = (_func_int **)0x0;
        local_180[0xb]._vptr_TIoMapResolver = (_func_int **)0x0;
        local_180[0xc]._vptr_TIoMapResolver = (_func_int **)0x0;
        local_180[0xd]._vptr_TIoMapResolver = (_func_int **)0x0;
        local_19c = 0;
        uStack_194 = 0;
        uStack_18d = 0;
        uStack_18c = 0;
        local_180[EVar3]._vptr_TIoMapResolver = (_func_int **)intermediate;
        local_1f0._vptr_TIoMapResolver = (_func_int **)&PTR__TDefaultIoResolverBase_00b0df60;
        local_5d8 = local_180 + 0xe;
        if ((intermediate->hlslIoMapping & 1U) != 0) {
          local_5d8 = &local_1f0;
        }
        if (resolver != (TIoMapResolver *)0x0) {
          local_5d8 = resolver;
        }
        local_64d._1_4_ = stage;
        local_5e0 = infoSink;
        (*local_5d8->_vptr_TIoMapResolver[0x14])
                  (local_5d8,CONCAT44(in_register_00000034,stage),intermediate);
        local_550._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_550._M_impl.super__Rb_tree_header._M_header;
        local_550._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_550._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_550._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_580._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_580._M_impl.super__Rb_tree_header._M_header;
        local_580._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_580._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_580._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_5b0._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_5b0._M_impl.super__Rb_tree_header._M_header;
        local_5b0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_5b0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_5b0._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_608.super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_608.super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_608.super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_628.super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_628.super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_628.super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_638 = 0;
        local_64d._5_8_ =
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
              *)0x0;
        ppStack_640 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
                       *)0x0;
        local_2d8 = &PTR__TIntermTraverser_00b096d8;
        local_2d0 = 0x101;
        local_2c0 = (TPoolAllocator *)0x0;
        uStack_2b8 = 0;
        local_2b0 = 0;
        uStack_2a8 = 0;
        local_2ce = 0;
        local_2c6 = 0;
        local_5b0._M_impl.super__Rb_tree_header._M_header._M_right =
             local_5b0._M_impl.super__Rb_tree_header._M_header._M_left;
        local_580._M_impl.super__Rb_tree_header._M_header._M_right =
             local_580._M_impl.super__Rb_tree_header._M_header._M_left;
        local_550._M_impl.super__Rb_tree_header._M_header._M_right =
             local_550._M_impl.super__Rb_tree_header._M_header._M_left;
        local_2c0 = GetThreadPoolAllocator();
        uStack_2b8 = 0;
        local_2b0 = 0;
        uStack_2a8 = 0;
        local_290 = 0;
        local_280._M_buckets = &local_280._M_single_bucket;
        local_280._M_bucket_count = 1;
        local_280._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        local_280._M_element_count = 0;
        local_280._M_rehash_policy._M_max_load_factor = 1.0;
        local_280._M_rehash_policy._M_next_resize = 0;
        local_280._M_single_bucket = (__node_base_ptr)0x0;
        local_248._M_buckets = &local_248._M_single_bucket;
        local_248._M_bucket_count = 1;
        local_248._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        local_248._M_element_count = 0;
        local_248._M_rehash_policy._M_max_load_factor = 1.0;
        local_248._M_rehash_policy._M_next_resize = 0;
        local_248._M_single_bucket = (__node_base_ptr)0x0;
        local_210 = 1;
        local_2d8 = &PTR__TLiveTraverser_00b0e020;
        local_208 = &local_550;
        local_200 = &local_580;
        pTVar1 = &local_3c0.destinations;
        local_3c0.super_TIntermTraverser._vptr_TIntermTraverser =
             (_func_int **)&PTR__TIntermTraverser_00b096d8;
        local_3c0.super_TIntermTraverser.preVisit = true;
        local_3c0.super_TIntermTraverser.inVisit = true;
        local_1f8 = &local_5b0;
        local_3c0.super_TIntermTraverser.path.
        super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
        super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl.
        super__Tp_alloc_type.allocator = (TPoolAllocator *)0x0;
        local_3c0.super_TIntermTraverser.path.
        super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
        super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_3c0.super_TIntermTraverser.path.
        super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
        super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_3c0.super_TIntermTraverser.path.
        super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
        super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_3c0.super_TIntermTraverser._10_8_ = 0;
        local_3c0.super_TIntermTraverser.maxDepth._2_2_ = 0;
        local_2a0 = &local_2a0;
        local_298 = &local_2a0;
        local_288 = intermediate;
        local_3c0.super_TIntermTraverser.path.
        super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
        super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl.
        super__Tp_alloc_type.allocator = GetThreadPoolAllocator();
        local_3c0.super_TIntermTraverser.path.
        super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
        super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_3c0.super_TIntermTraverser.path.
        super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
        super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_3c0.super_TIntermTraverser.path.
        super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
        super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_3c0.destinations.
        super__List_base<glslang::TIntermAggregate_*,_std::allocator<glslang::TIntermAggregate_*>_>.
        _M_impl._M_node._M_size = 0;
        local_3c0.liveFunctions._M_h._M_buckets = &local_3c0.liveFunctions._M_h._M_single_bucket;
        local_3c0.liveFunctions._M_h._M_bucket_count = 1;
        local_3c0.liveFunctions._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        local_3c0.liveFunctions._M_h._M_element_count = 0;
        local_3c0.liveFunctions._M_h._M_rehash_policy._M_max_load_factor = 1.0;
        local_3c0.liveFunctions._M_h._M_rehash_policy._M_next_resize = 0;
        local_3c0.liveFunctions._M_h._M_single_bucket = (__node_base_ptr)0x0;
        local_3c0.liveGlobals._M_h._M_buckets = &local_3c0.liveGlobals._M_h._M_single_bucket;
        local_3c0.liveGlobals._M_h._M_bucket_count = 1;
        local_3c0.liveGlobals._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        local_3c0.liveGlobals._M_h._M_element_count = 0;
        local_3c0.liveGlobals._M_h._M_rehash_policy._M_max_load_factor = 1.0;
        local_3c0.liveGlobals._M_h._M_rehash_policy._M_next_resize = 0;
        local_3c0.liveGlobals._M_h._M_single_bucket = (__node_base_ptr)0x0;
        local_3c0.traverseAll = false;
        local_3c0.super_TIntermTraverser._vptr_TIntermTraverser =
             (_func_int **)&PTR__TLiveTraverser_00b0e020;
        local_2f0 = &local_550;
        local_2e8 = &local_580;
        local_2e0 = &local_5b0;
        local_3c0.destinations.
        super__List_base<glslang::TIntermAggregate_*,_std::allocator<glslang::TIntermAggregate_*>_>.
        _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)pTVar1;
        local_3c0.destinations.
        super__List_base<glslang::TIntermAggregate_*,_std::allocator<glslang::TIntermAggregate_*>_>.
        _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)pTVar1;
        local_3c0.intermediate = intermediate;
        (*local_5f0->_vptr_TIntermNode[2])(local_5f0,&local_2d8);
        __s = (intermediate->entryPointMangledName)._M_dataplus._M_p;
        local_438.allocator = GetThreadPoolAllocator();
        std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
        basic_string<glslang::std::allocator<char>>
                  ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                   local_520,__s,&local_438);
        TLiveTraverser::pushFunction(&local_3c0,(TString *)local_520);
        local_5e8 = &local_3c0;
        if (local_3c0.destinations.
            super__List_base<glslang::TIntermAggregate_*,_std::allocator<glslang::TIntermAggregate_*>_>
            ._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)pTVar1) {
          do {
            p_Var7 = local_3c0.destinations.
                     super__List_base<glslang::TIntermAggregate_*,_std::allocator<glslang::TIntermAggregate_*>_>
                     ._M_impl._M_node.super__List_node_base._M_prev;
            p_Var4 = local_3c0.destinations.
                     super__List_base<glslang::TIntermAggregate_*,_std::allocator<glslang::TIntermAggregate_*>_>
                     ._M_impl._M_node.super__List_node_base._M_prev[1]._M_next;
            local_3c0.destinations.
            super__List_base<glslang::TIntermAggregate_*,_std::allocator<glslang::TIntermAggregate_*>_>
            ._M_impl._M_node._M_size =
                 local_3c0.destinations.
                 super__List_base<glslang::TIntermAggregate_*,_std::allocator<glslang::TIntermAggregate_*>_>
                 ._M_impl._M_node._M_size - 1;
            std::__detail::_List_node_base::_M_unhook();
            operator_delete(p_Var7,0x18);
            (*(code *)p_Var4->_M_next[1]._M_next)(p_Var4,&local_3c0);
          } while (local_3c0.destinations.
                   super__List_base<glslang::TIntermAggregate_*,_std::allocator<glslang::TIntermAggregate_*>_>
                   ._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)pTVar1);
        }
        p_Var2 = &local_550._M_impl.super__Rb_tree_header;
        if ((_Rb_tree_header *)local_550._M_impl.super__Rb_tree_header._M_header._M_left != p_Var2)
        {
          p_Var16 = local_550._M_impl.super__Rb_tree_header._M_header._M_left;
          do {
            local_520._0_8_ = GetThreadPoolAllocator();
            local_520._8_2_ = SUB82(local_520 + 0x18,0);
            local_520._10_6_ = (undefined6)((ulong)(local_520 + 0x18) >> 0x10);
            std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
            _M_construct<char*>((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>
                                 *)local_520,p_Var16[1]._M_parent,
                                (long)&(p_Var16[1]._M_left)->_M_color + (long)p_Var16[1]._M_parent);
            p_Stack_4f8 = p_Var16[2]._M_parent;
            pTStack_4f0 = (TIntermSymbol *)p_Var16[2]._M_left;
            local_4e8 = p_Var16[2]._M_right;
            p_Stack_4e0 = *(_Base_ptr *)(p_Var16 + 3);
            local_4d8 = p_Var16[3]._M_parent;
            pTStack_4d0 = (TIntermediate *)p_Var16[3]._M_left;
            std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>::
            emplace_back<glslang::TVarLivePair>(&local_608,(TVarLivePair *)local_520);
            p_Var16 = (_Base_ptr)std::_Rb_tree_increment(p_Var16);
          } while ((_Rb_tree_header *)p_Var16 != p_Var2);
        }
        pTVar13 = local_608.
                  super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        pTVar12 = local_608.
                  super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        p_Var2 = &local_580._M_impl.super__Rb_tree_header;
        if (local_608.
            super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>.
            _M_impl.super__Vector_impl_data._M_start !=
            local_608.
            super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          lVar23 = (long)local_608.
                         super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_608.
                         super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                         ._M_impl.super__Vector_impl_data._M_start;
          uVar18 = (lVar23 >> 3) * 0x2e8ba2e8ba2e8ba3;
          lVar21 = 0x3f;
          if (uVar18 != 0) {
            for (; uVar18 >> lVar21 == 0; lVar21 = lVar21 + -1) {
            }
          }
          std::
          __introsort_loop<__gnu_cxx::__normal_iterator<glslang::TVarLivePair*,std::vector<glslang::TVarLivePair,std::allocator<glslang::TVarLivePair>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<glslang::TIoMapper::addStage(EShLanguage,glslang::TIntermediate&,TInfoSink&,glslang::TIoMapResolver*)::__0>>
                    (local_608.
                     super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     local_608.
                     super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                     ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar21 ^ 0x3f) * 2 ^ 0x7e);
          if (lVar23 < 0x581) {
            std::
            __insertion_sort<__gnu_cxx::__normal_iterator<glslang::TVarLivePair*,std::vector<glslang::TVarLivePair,std::allocator<glslang::TVarLivePair>>>,__gnu_cxx::__ops::_Iter_comp_iter<glslang::TIoMapper::addStage(EShLanguage,glslang::TIntermediate&,TInfoSink&,glslang::TIoMapResolver*)::__0>>
                      (pTVar12,pTVar13);
          }
          else {
            ppVar24 = &pTVar12[0x10].
                       super_pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
            ;
            std::
            __insertion_sort<__gnu_cxx::__normal_iterator<glslang::TVarLivePair*,std::vector<glslang::TVarLivePair,std::allocator<glslang::TVarLivePair>>>,__gnu_cxx::__ops::_Iter_comp_iter<glslang::TIoMapper::addStage(EShLanguage,glslang::TIntermediate&,TInfoSink&,glslang::TIoMapResolver*)::__0>>
                      (pTVar12,ppVar24);
            for (; ppVar24 !=
                   &pTVar13->
                    super_pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
                ; ppVar24 = ppVar24 + 1) {
              std::
              __unguarded_linear_insert<__gnu_cxx::__normal_iterator<glslang::TVarLivePair*,std::vector<glslang::TVarLivePair,std::allocator<glslang::TVarLivePair>>>,__gnu_cxx::__ops::_Val_comp_iter<glslang::TIoMapper::addStage(EShLanguage,glslang::TIntermediate&,TInfoSink&,glslang::TIoMapResolver*)::__0>>
                        (ppVar24);
            }
          }
        }
        if ((_Rb_tree_header *)local_580._M_impl.super__Rb_tree_header._M_header._M_left != p_Var2)
        {
          p_Var16 = local_580._M_impl.super__Rb_tree_header._M_header._M_left;
          do {
            local_520._0_8_ = GetThreadPoolAllocator();
            local_520._8_2_ = SUB82(local_520 + 0x18,0);
            local_520._10_6_ = (undefined6)((ulong)(local_520 + 0x18) >> 0x10);
            std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
            _M_construct<char*>((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>
                                 *)local_520,p_Var16[1]._M_parent,
                                (long)&(p_Var16[1]._M_left)->_M_color + (long)p_Var16[1]._M_parent);
            p_Stack_4f8 = p_Var16[2]._M_parent;
            pTStack_4f0 = (TIntermSymbol *)p_Var16[2]._M_left;
            local_4e8 = p_Var16[2]._M_right;
            p_Stack_4e0 = *(_Base_ptr *)(p_Var16 + 3);
            local_4d8 = p_Var16[3]._M_parent;
            pTStack_4d0 = (TIntermediate *)p_Var16[3]._M_left;
            std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>::
            emplace_back<glslang::TVarLivePair>(&local_628,(TVarLivePair *)local_520);
            p_Var16 = (_Base_ptr)std::_Rb_tree_increment(p_Var16);
          } while ((_Rb_tree_header *)p_Var16 != p_Var2);
        }
        pTVar13 = local_628.
                  super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        pTVar12 = local_628.
                  super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        p_Var2 = &local_5b0._M_impl.super__Rb_tree_header;
        if (local_628.
            super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>.
            _M_impl.super__Vector_impl_data._M_start !=
            local_628.
            super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          lVar23 = (long)local_628.
                         super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_628.
                         super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                         ._M_impl.super__Vector_impl_data._M_start;
          uVar18 = (lVar23 >> 3) * 0x2e8ba2e8ba2e8ba3;
          lVar21 = 0x3f;
          if (uVar18 != 0) {
            for (; uVar18 >> lVar21 == 0; lVar21 = lVar21 + -1) {
            }
          }
          std::
          __introsort_loop<__gnu_cxx::__normal_iterator<glslang::TVarLivePair*,std::vector<glslang::TVarLivePair,std::allocator<glslang::TVarLivePair>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<glslang::TIoMapper::addStage(EShLanguage,glslang::TIntermediate&,TInfoSink&,glslang::TIoMapResolver*)::__1>>
                    (local_628.
                     super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     local_628.
                     super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                     ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar21 ^ 0x3f) * 2 ^ 0x7e);
          if (lVar23 < 0x581) {
            std::
            __insertion_sort<__gnu_cxx::__normal_iterator<glslang::TVarLivePair*,std::vector<glslang::TVarLivePair,std::allocator<glslang::TVarLivePair>>>,__gnu_cxx::__ops::_Iter_comp_iter<glslang::TIoMapper::addStage(EShLanguage,glslang::TIntermediate&,TInfoSink&,glslang::TIoMapResolver*)::__1>>
                      (pTVar12,pTVar13);
          }
          else {
            ppVar24 = &pTVar12[0x10].
                       super_pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
            ;
            std::
            __insertion_sort<__gnu_cxx::__normal_iterator<glslang::TVarLivePair*,std::vector<glslang::TVarLivePair,std::allocator<glslang::TVarLivePair>>>,__gnu_cxx::__ops::_Iter_comp_iter<glslang::TIoMapper::addStage(EShLanguage,glslang::TIntermediate&,TInfoSink&,glslang::TIoMapResolver*)::__1>>
                      (pTVar12,ppVar24);
            for (; ppVar24 !=
                   &pTVar13->
                    super_pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
                ; ppVar24 = ppVar24 + 1) {
              std::
              __unguarded_linear_insert<__gnu_cxx::__normal_iterator<glslang::TVarLivePair*,std::vector<glslang::TVarLivePair,std::allocator<glslang::TVarLivePair>>>,__gnu_cxx::__ops::_Val_comp_iter<glslang::TIoMapper::addStage(EShLanguage,glslang::TIntermediate&,TInfoSink&,glslang::TIoMapResolver*)::__1>>
                        (ppVar24);
            }
          }
        }
        if ((_Rb_tree_header *)local_5b0._M_impl.super__Rb_tree_header._M_header._M_left != p_Var2)
        {
          p_Var16 = local_5b0._M_impl.super__Rb_tree_header._M_header._M_left;
          do {
            local_520._0_8_ = GetThreadPoolAllocator();
            local_520._8_2_ = SUB82(local_520 + 0x18,0);
            local_520._10_6_ = (undefined6)((ulong)(local_520 + 0x18) >> 0x10);
            std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
            _M_construct<char*>((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>
                                 *)local_520,p_Var16[1]._M_parent,
                                (long)&(p_Var16[1]._M_left)->_M_color + (long)p_Var16[1]._M_parent);
            p_Stack_4f8 = p_Var16[2]._M_parent;
            pTStack_4f0 = (TIntermSymbol *)p_Var16[2]._M_left;
            local_4e8 = p_Var16[2]._M_right;
            p_Stack_4e0 = *(_Base_ptr *)(p_Var16 + 3);
            local_4d8 = p_Var16[3]._M_parent;
            pTStack_4d0 = (TIntermediate *)p_Var16[3]._M_left;
            std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>::
            emplace_back<glslang::TVarLivePair>
                      ((vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_> *)
                       (local_64d + 5),(TVarLivePair *)local_520);
            p_Var16 = (_Base_ptr)std::_Rb_tree_increment(p_Var16);
          } while ((_Rb_tree_header *)p_Var16 != p_Var2);
        }
        pTVar14 = local_5d8;
        ppVar24 = ppStack_640;
        uVar11 = local_64d._5_8_;
        uVar10 = local_64d._1_4_;
        if ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
             *)local_64d._5_8_ != ppStack_640) {
          lVar23 = (long)ppStack_640 - local_64d._5_8_;
          uVar18 = (lVar23 >> 3) * 0x2e8ba2e8ba2e8ba3;
          lVar21 = 0x3f;
          if (uVar18 != 0) {
            for (; uVar18 >> lVar21 == 0; lVar21 = lVar21 + -1) {
            }
          }
          std::
          __introsort_loop<__gnu_cxx::__normal_iterator<glslang::TVarLivePair*,std::vector<glslang::TVarLivePair,std::allocator<glslang::TVarLivePair>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<glslang::TIoMapper::addStage(EShLanguage,glslang::TIntermediate&,TInfoSink&,glslang::TIoMapResolver*)::__2>>
                    (local_64d._5_8_,ppStack_640,((uint)lVar21 ^ 0x3f) * 2 ^ 0x7e);
          if (lVar23 < 0x581) {
            std::
            __insertion_sort<__gnu_cxx::__normal_iterator<glslang::TVarLivePair*,std::vector<glslang::TVarLivePair,std::allocator<glslang::TVarLivePair>>>,__gnu_cxx::__ops::_Iter_comp_iter<glslang::TIoMapper::addStage(EShLanguage,glslang::TIntermediate&,TInfoSink&,glslang::TIoMapResolver*)::__2>>
                      (uVar11,ppVar24);
          }
          else {
            ppVar25 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
                       *)(uVar11 + 0x580);
            std::
            __insertion_sort<__gnu_cxx::__normal_iterator<glslang::TVarLivePair*,std::vector<glslang::TVarLivePair,std::allocator<glslang::TVarLivePair>>>,__gnu_cxx::__ops::_Iter_comp_iter<glslang::TIoMapper::addStage(EShLanguage,glslang::TIntermediate&,TInfoSink&,glslang::TIoMapResolver*)::__2>>
                      (uVar11,ppVar25);
            for (; ppVar25 != ppVar24; ppVar25 = ppVar25 + 1) {
              std::
              __unguarded_linear_insert<__gnu_cxx::__normal_iterator<glslang::TVarLivePair*,std::vector<glslang::TVarLivePair,std::allocator<glslang::TVarLivePair>>>,__gnu_cxx::__ops::_Val_comp_iter<glslang::TIoMapper::addStage(EShLanguage,glslang::TIntermediate&,TInfoSink&,glslang::TIoMapResolver*)::__2>>
                        (ppVar25);
            }
          }
        }
        local_5d0.error = (bool *)local_64d;
        local_64d[0] = 0;
        local_3d8 = 0;
        uStack_3d0 = 0;
        local_3e8 = 0;
        uStack_3e0 = 0;
        local_3f8 = 0;
        uStack_3f0 = 0;
        local_408 = 0;
        uStack_400 = 0;
        local_418 = 0;
        uStack_410 = 0;
        local_428 = 0;
        uStack_420 = 0;
        local_438.allocator = (TPoolAllocator *)0x0;
        uStack_430 = 0;
        local_5d0.stage = uVar10;
        local_5d0.resolver = pTVar14;
        local_5d0.infoSink = local_5e0;
        (*pTVar14->_vptr_TIoMapResolver[0xc])(pTVar14,(ulong)(uint)uVar10);
        pTVar12 = local_608.
                  super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        for (ppVar24 = &(local_608.
                         super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                        super_pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
            ; pTVar13 = local_628.
                        super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                        ._M_impl.super__Vector_impl_data._M_finish,
            ppVar25 = &(local_628.
                        super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                       super_pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
            , ppVar24 !=
              &pTVar12->
               super_pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
            ; ppVar24 = ppVar24 + 1) {
          (*pTVar14->_vptr_TIoMapResolver[0xb])
                    (pTVar14,(ulong)(ppVar24->second).stage,&ppVar24->second);
        }
        for (; ppVar24 = ppStack_640,
            ppVar26 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
                       *)local_64d._5_8_,
            ppVar25 !=
            &pTVar13->
             super_pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
            ; ppVar25 = ppVar25 + 1) {
          (*pTVar14->_vptr_TIoMapResolver[0xb])
                    (pTVar14,(ulong)(ppVar25->second).stage,&ppVar25->second);
        }
        for (; ppVar26 != ppVar24; ppVar26 = ppVar26 + 1) {
          (*pTVar14->_vptr_TIoMapResolver[10])(pTVar14,(ulong)(uint)uVar10,&ppVar26->second);
        }
        (*pTVar14->_vptr_TIoMapResolver[0xd])(pTVar14,(ulong)(uint)uVar10);
        (*pTVar14->_vptr_TIoMapResolver[0xe])(pTVar14,(ulong)(uint)uVar10);
        pTVar12 = local_608.
                  super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        if (local_608.
            super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>.
            _M_impl.super__Vector_impl_data._M_start !=
            local_608.
            super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          ppVar24 = &(local_608.
                      super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                     super_pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
          ;
          do {
            TResolverInOutAdaptor::operator()(&local_5d0,ppVar24);
            ppVar24 = ppVar24 + 1;
          } while (ppVar24 !=
                   &pTVar12->
                    super_pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
                  );
        }
        pTVar12 = local_608.
                  super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        if (local_608.
            super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>.
            _M_impl.super__Vector_impl_data._M_start !=
            local_608.
            super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          ppVar24 = &(local_608.
                      super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                     super_pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
          ;
          do {
            local_520._0_8_ = GetThreadPoolAllocator();
            local_520._8_2_ = SUB82(local_520 + 0x18,0);
            local_520._10_6_ = (undefined6)((ulong)(local_520 + 0x18) >> 0x10);
            pcVar5 = (ppVar24->first)._M_dataplus._M_p;
            std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
            _M_construct<char*>((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>
                                 *)local_520,pcVar5,pcVar5 + (ppVar24->first)._M_string_length);
            p_Stack_4f8 = (_Base_ptr)(ppVar24->second).id;
            pTStack_4f0 = (ppVar24->second).symbol;
            local_4e8 = *(_Base_ptr *)&(ppVar24->second).live;
            p_Stack_4e0 = *(_Base_ptr *)&(ppVar24->second).newBinding;
            local_4d8 = *(_Base_ptr *)&(ppVar24->second).newLocation;
            pTStack_4d0 = *(TIntermediate **)&(ppVar24->second).newIndex;
            iVar15 = (*(pTStack_4f0->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x34])
                               ();
            iVar17 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
                     ::find(&local_550,(key_type *)CONCAT44(extraout_var,iVar15));
            if (((_Rb_tree_header *)iVar17._M_node != &local_550._M_impl.super__Rb_tree_header) &&
               (p_Stack_4f8 == iVar17._M_node[2]._M_parent)) {
              iVar17._M_node[3]._M_parent = local_4d8;
              iVar17._M_node[3]._M_left = (_Base_ptr)pTStack_4d0;
              iVar17._M_node[2]._M_right = local_4e8;
              *(_Base_ptr *)(iVar17._M_node + 3) = p_Stack_4e0;
              iVar17._M_node[2]._M_parent = p_Stack_4f8;
              iVar17._M_node[2]._M_left = (_Base_ptr)pTStack_4f0;
            }
            ppVar24 = ppVar24 + 1;
          } while (ppVar24 !=
                   &pTVar12->
                    super_pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
                  );
        }
        pTVar12 = local_628.
                  super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        if (local_628.
            super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>.
            _M_impl.super__Vector_impl_data._M_start !=
            local_628.
            super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          ppVar24 = &(local_628.
                      super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                     super_pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
          ;
          do {
            TResolverInOutAdaptor::operator()(&local_5d0,ppVar24);
            ppVar24 = ppVar24 + 1;
          } while (ppVar24 !=
                   &pTVar12->
                    super_pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
                  );
        }
        pTVar12 = local_628.
                  super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        if (local_628.
            super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>.
            _M_impl.super__Vector_impl_data._M_start !=
            local_628.
            super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          ppVar24 = &(local_628.
                      super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                     super_pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
          ;
          do {
            local_520._0_8_ = GetThreadPoolAllocator();
            local_520._8_2_ = SUB82(local_520 + 0x18,0);
            local_520._10_6_ = (undefined6)((ulong)(local_520 + 0x18) >> 0x10);
            pcVar5 = (ppVar24->first)._M_dataplus._M_p;
            std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
            _M_construct<char*>((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>
                                 *)local_520,pcVar5,pcVar5 + (ppVar24->first)._M_string_length);
            p_Stack_4f8 = (_Base_ptr)(ppVar24->second).id;
            pTStack_4f0 = (ppVar24->second).symbol;
            local_4e8 = *(_Base_ptr *)&(ppVar24->second).live;
            p_Stack_4e0 = *(_Base_ptr *)&(ppVar24->second).newBinding;
            local_4d8 = *(_Base_ptr *)&(ppVar24->second).newLocation;
            pTStack_4d0 = *(TIntermediate **)&(ppVar24->second).newIndex;
            iVar15 = (*(pTStack_4f0->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x34])
                               ();
            iVar17 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
                     ::find(&local_580,(key_type *)CONCAT44(extraout_var_00,iVar15));
            if (((_Rb_tree_header *)iVar17._M_node != &local_580._M_impl.super__Rb_tree_header) &&
               (p_Stack_4f8 == iVar17._M_node[2]._M_parent)) {
              iVar17._M_node[3]._M_parent = local_4d8;
              iVar17._M_node[3]._M_left = (_Base_ptr)pTStack_4d0;
              iVar17._M_node[2]._M_right = local_4e8;
              *(_Base_ptr *)(iVar17._M_node + 3) = p_Stack_4e0;
              iVar17._M_node[2]._M_parent = p_Stack_4f8;
              iVar17._M_node[2]._M_left = (_Base_ptr)pTStack_4f0;
            }
            ppVar24 = ppVar24 + 1;
          } while (ppVar24 !=
                   &pTVar12->
                    super_pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
                  );
        }
        ppVar24 = ppStack_640;
        ppVar19 = &local_438;
        puVar20 = &uStack_500;
        for (lVar21 = 0xe; lVar21 != 0; lVar21 = lVar21 + -1) {
          *puVar20 = ppVar19->allocator;
          ppVar19 = ppVar19 + (ulong)bVar29 * -2 + 1;
          puVar20 = puVar20 + (ulong)bVar29 * -2 + 1;
        }
        local_520._0_4_ = local_64d._1_4_;
        local_520._8_2_ = SUB82(pTVar14,0);
        local_520._10_6_ = (undefined6)((ulong)pTVar14 >> 0x10);
        local_520._16_2_ = SUB82(local_5e0,0);
        local_520._18_2_ = (undefined2)((ulong)local_5e0 >> 0x10);
        local_520._20_4_ = (undefined4)((ulong)local_5e0 >> 0x20);
        local_520._24_8_ = local_64d;
        if ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
             *)local_64d._5_8_ != ppStack_640) {
          ppVar25 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
                     *)local_64d._5_8_;
          do {
            TResolverUniformAdaptor::operator()((TResolverUniformAdaptor *)local_520,ppVar25);
            ppVar25 = ppVar25 + 1;
          } while (ppVar25 != ppVar24);
        }
        ppVar24 = ppStack_640;
        if ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
             *)local_64d._5_8_ != ppStack_640) {
          ppVar25 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
                     *)local_64d._5_8_;
          do {
            local_520._0_8_ = GetThreadPoolAllocator();
            local_520._8_2_ = SUB82(local_520 + 0x18,0);
            local_520._10_6_ = (undefined6)((ulong)(local_520 + 0x18) >> 0x10);
            pcVar5 = (ppVar25->first)._M_dataplus._M_p;
            std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
            _M_construct<char*>((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>
                                 *)local_520,pcVar5,pcVar5 + (ppVar25->first)._M_string_length);
            p_Stack_4f8 = (_Base_ptr)(ppVar25->second).id;
            pTStack_4f0 = (ppVar25->second).symbol;
            local_4e8 = *(_Base_ptr *)&(ppVar25->second).live;
            p_Stack_4e0 = *(_Base_ptr *)&(ppVar25->second).newBinding;
            local_4d8 = *(_Base_ptr *)&(ppVar25->second).newLocation;
            pTStack_4d0 = *(TIntermediate **)&(ppVar25->second).newIndex;
            iVar15 = (*(pTStack_4f0->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x34])
                               ();
            iVar17 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
                     ::find(&local_5b0,(key_type *)CONCAT44(extraout_var_01,iVar15));
            if (((_Rb_tree_header *)iVar17._M_node != &local_5b0._M_impl.super__Rb_tree_header) &&
               (p_Stack_4f8 == iVar17._M_node[2]._M_parent)) {
              iVar17._M_node[3]._M_parent = local_4d8;
              iVar17._M_node[3]._M_left = (_Base_ptr)pTStack_4d0;
              iVar17._M_node[2]._M_right = local_4e8;
              *(_Base_ptr *)(iVar17._M_node + 3) = p_Stack_4e0;
              iVar17._M_node[2]._M_parent = p_Stack_4f8;
              iVar17._M_node[2]._M_left = (_Base_ptr)pTStack_4f0;
            }
            ppVar25 = ppVar25 + 1;
          } while (ppVar25 != ppVar24);
        }
        local_5e8 = (TLiveTraverser *)&local_5e8->liveGlobals;
        (*pTVar14->_vptr_TIoMapResolver[0xf])(pTVar14,(ulong)(uint)local_64d._1_4_);
        if (local_64d[0] == 0) {
          local_520._0_8_ = &PTR__TIntermTraverser_00b096d8;
          local_520._8_2_ = 0x101;
          local_520._24_8_ = 0;
          uStack_500 = 0;
          p_Stack_4f8 = (_Base_ptr)0x0;
          pTStack_4f0 = (TIntermSymbol *)0x0;
          local_520._10_6_ = 0;
          local_520._16_2_ = 0;
          local_520._18_2_ = 0;
          local_520._24_8_ = GetThreadPoolAllocator();
          uStack_500 = 0;
          p_Stack_4f8 = (_Base_ptr)0x0;
          pTStack_4f0 = (TIntermSymbol *)0x0;
          local_4d8 = (_Base_ptr)0x0;
          local_4c8._0_8_ = local_4c8 + 0x30;
          local_4c8._8_8_ = (TVarLiveMap *)0x1;
          local_4c8._16_8_ = (TVarLiveMap *)0x0;
          local_4c8._24_8_ = (TVarLiveMap *)0x0;
          local_4c8._32_4_ = 1.0;
          local_4c8._40_8_ = (TVarLiveMap *)0x0;
          local_4c8._48_8_ = (TVarLiveMap *)0x0;
          local_490._M_buckets = &local_490._M_single_bucket;
          local_490._M_bucket_count = 1;
          local_490._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
          local_490._M_element_count = 0;
          local_490._M_rehash_policy._M_max_load_factor = 1.0;
          local_490._M_rehash_policy._M_next_resize = 0;
          local_490._M_single_bucket = (__node_base_ptr)0x0;
          local_458 = 1;
          local_520._0_8_ = &PTR__TLiveTraverser_00b0e088;
          local_450 = &local_550;
          local_448 = &local_580;
          local_440 = &local_5b0;
          local_4e8 = (_Base_ptr)&local_4e8;
          p_Stack_4e0 = (_Base_ptr)&local_4e8;
          pTStack_4d0 = intermediate;
          (*local_5f0->_vptr_TIntermNode[2])(local_5f0,local_520);
          local_520._0_8_ = &PTR__TLiveTraverser_00b09898;
          std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::~_Hashtable(&local_490);
          std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                         *)local_4c8);
          p_Var16 = local_4e8;
          while (p_Var16 != (_Base_ptr)&local_4e8) {
            p_Var6 = *(_Base_ptr *)p_Var16;
            operator_delete(p_Var16,0x18);
            p_Var16 = p_Var6;
          }
        }
        bVar22 = local_64d[0];
        local_3c0.super_TIntermTraverser._vptr_TIntermTraverser =
             (_func_int **)&PTR__TLiveTraverser_00b09898;
        std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
        ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                       *)local_5e8);
        std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
        ::~_Hashtable(&local_3c0.liveFunctions._M_h);
        p_Var4 = local_3c0.destinations.
                 super__List_base<glslang::TIntermAggregate_*,_std::allocator<glslang::TIntermAggregate_*>_>
                 ._M_impl._M_node.super__List_node_base._M_next;
        while (p_Var4 != (_List_node_base *)&local_3c0.destinations) {
          p_Var7 = (((_List_base<glslang::TIntermAggregate_*,_std::allocator<glslang::TIntermAggregate_*>_>
                      *)&p_Var4->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
          operator_delete(p_Var4,0x18);
          p_Var4 = p_Var7;
        }
        local_2d8 = &PTR__TLiveTraverser_00b09898;
        std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
        ::~_Hashtable(&local_248);
        std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
        ::~_Hashtable(&local_280);
        pppppppuVar9 = (undefined8 *******)local_2a0;
        while (pppppppuVar9 != &local_2a0) {
          pppppppuVar8 = (undefined8 *******)*pppppppuVar9;
          operator_delete(pppppppuVar9,0x18);
          pppppppuVar9 = pppppppuVar8;
        }
        if ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
             *)local_64d._5_8_ !=
            (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
             *)0x0) {
          operator_delete((void *)local_64d._5_8_,local_638 - local_64d._5_8_);
        }
        if (&(local_628.
              super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>.
              _M_impl.super__Vector_impl_data._M_start)->
             super_pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
            != (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
                *)0x0) {
          operator_delete(local_628.
                          super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_628.
                                super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_628.
                                super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (&(local_608.
              super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>.
              _M_impl.super__Vector_impl_data._M_start)->
             super_pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
            != (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
                *)0x0) {
          operator_delete(local_608.
                          super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_608.
                                super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_608.
                                super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        bVar22 = bVar22 ^ 1;
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
        ::_M_erase(&local_5b0,
                   (_Link_type)local_5b0._M_impl.super__Rb_tree_header._M_header._M_parent);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
        ::_M_erase(&local_580,
                   (_Link_type)local_580._M_impl.super__Rb_tree_header._M_header._M_parent);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
        ::_M_erase(&local_550,
                   (_Link_type)local_550._M_impl.super__Rb_tree_header._M_header._M_parent);
        local_1f0._vptr_TIoMapResolver = (_func_int **)&PTR__TDefaultIoResolverBase_00b0dcb0;
        std::
        _Hashtable<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::~_Hashtable(&local_1e8);
        local_180[0xe]._vptr_TIoMapResolver = (_func_int **)&PTR__TDefaultIoResolverBase_00b0dcb0;
        std::
        _Hashtable<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::~_Hashtable(&local_108);
      }
    }
    else {
      bVar22 = 0;
    }
  }
  return (bool)bVar22;
}

Assistant:

bool TIoMapper::addStage(EShLanguage stage, TIntermediate& intermediate, TInfoSink& infoSink, TIoMapResolver* resolver) {
    bool somethingToDo = ! intermediate.getResourceSetBinding().empty() || intermediate.getAutoMapBindings() ||
                         intermediate.getAutoMapLocations();
    // Restrict the stricter condition to further check 'somethingToDo' only if 'somethingToDo' has not been set, reduce
    // unnecessary or insignificant for-loop operation after 'somethingToDo' have been true.
    for (int res = 0; (res < EResCount && !somethingToDo); ++res) {
        somethingToDo = somethingToDo || (intermediate.getShiftBinding(TResourceType(res)) != 0) ||
                        intermediate.hasShiftBindingForSet(TResourceType(res));
    }
    if (! somethingToDo && resolver == nullptr)
        return true;
    if (intermediate.getNumEntryPoints() != 1 || intermediate.isRecursive())
        return false;
    TIntermNode* root = intermediate.getTreeRoot();
    if (root == nullptr)
        return false;
    // if no resolver is provided, use the default resolver with the given shifts and auto map settings
    TDefaultIoResolver defaultResolver(intermediate);
#ifdef ENABLE_HLSL
    TDefaultHlslIoResolver defaultHlslResolver(intermediate);
    if (resolver == nullptr) {
        // TODO: use a passed in IO mapper for this
        if (intermediate.usingHlslIoMapping())
            resolver = &defaultHlslResolver;
        else
            resolver = &defaultResolver;
    }
#else
    resolver = &defaultResolver;
#endif
    resolver->addStage(stage, intermediate);

    TVarLiveMap inVarMap, outVarMap, uniformVarMap;
    TVarLiveVector inVector, outVector, uniformVector;
    TVarGatherTraverser iter_binding_all(intermediate, true, inVarMap, outVarMap, uniformVarMap);
    TVarGatherTraverser iter_binding_live(intermediate, false, inVarMap, outVarMap, uniformVarMap);
    root->traverse(&iter_binding_all);
    iter_binding_live.pushFunction(intermediate.getEntryPointMangledName().c_str());
    while (! iter_binding_live.destinations.empty()) {
        TIntermNode* destination = iter_binding_live.destinations.back();
        iter_binding_live.destinations.pop_back();
        destination->traverse(&iter_binding_live);
    }

    // sort entries by priority. see TVarEntryInfo::TOrderByPriority for info.
    for (auto& var : inVarMap) { inVector.push_back(var); }
    std::sort(inVector.begin(), inVector.end(), [](const TVarLivePair& p1, const TVarLivePair& p2) -> bool {
        return TVarEntryInfo::TOrderByPriority()(p1.second, p2.second);
    });
    for (auto& var : outVarMap) { outVector.push_back(var); }
    std::sort(outVector.begin(), outVector.end(), [](const TVarLivePair& p1, const TVarLivePair& p2) -> bool {
        return TVarEntryInfo::TOrderByPriority()(p1.second, p2.second);
    });
    for (auto& var : uniformVarMap) { uniformVector.push_back(var); }
    std::sort(uniformVector.begin(), uniformVector.end(), [](const TVarLivePair& p1, const TVarLivePair& p2) -> bool {
        return TVarEntryInfo::TOrderByPriority()(p1.second, p2.second);
    });
    bool hadError = false;
    TVarLiveMap* dummyUniformVarMap[EShLangCount] = {};
    TNotifyInOutAdaptor inOutNotify(stage, *resolver);
    TNotifyUniformAdaptor uniformNotify(stage, *resolver);
    TResolverUniformAdaptor uniformResolve(stage, *resolver, dummyUniformVarMap, infoSink, hadError);
    TResolverInOutAdaptor inOutResolve(stage, *resolver, infoSink, hadError);
    resolver->beginNotifications(stage);
    std::for_each(inVector.begin(), inVector.end(), inOutNotify);
    std::for_each(outVector.begin(), outVector.end(), inOutNotify);
    std::for_each(uniformVector.begin(), uniformVector.end(), uniformNotify);
    resolver->endNotifications(stage);
    resolver->beginResolve(stage);
    for (auto& var : inVector) { inOutResolve(var); }
    std::for_each(inVector.begin(), inVector.end(), [&inVarMap](TVarLivePair p) {
        auto at = inVarMap.find(p.second.symbol->getAccessName());
        if (at != inVarMap.end() && p.second.id == at->second.id)
            at->second = p.second;
    });
    for (auto& var : outVector) { inOutResolve(var); }
    std::for_each(outVector.begin(), outVector.end(), [&outVarMap](TVarLivePair p) {
        auto at = outVarMap.find(p.second.symbol->getAccessName());
        if (at != outVarMap.end() && p.second.id == at->second.id)
            at->second = p.second;
    });
    std::for_each(uniformVector.begin(), uniformVector.end(), uniformResolve);
    std::for_each(uniformVector.begin(), uniformVector.end(), [&uniformVarMap](TVarLivePair p) {
        auto at = uniformVarMap.find(p.second.symbol->getAccessName());
        if (at != uniformVarMap.end() && p.second.id == at->second.id)
            at->second = p.second;
    });
    resolver->endResolve(stage);
    if (!hadError) {
        TVarSetTraverser iter_iomap(intermediate, inVarMap, outVarMap, uniformVarMap);
        root->traverse(&iter_iomap);
    }
    return !hadError;
}